

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_recovery.cpp
# Opt level: O1

void __thiscall
RecoveryTest_PureVirtualMethodCallTest_Test::TestBody
          (RecoveryTest_PureVirtualMethodCallTest_Test *this)

{
  DeathTest *pDVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *message;
  DeathTest *gtest_dt;
  scoped_ptr<testing::internal::DeathTest> gtest_dt_ptr;
  char regex [31];
  DeathTest *local_118;
  DeathTest *local_110;
  ExitedOrKilled local_108 [4];
  char local_e8 [32];
  Base local_c8;
  RE local_b8;
  
  builtin_strncpy(local_e8,"PosixCrashHandler::handleCrash",0x1f);
  bVar2 = testing::internal::AlwaysTrue();
  if (!bVar2) goto LAB_0010c901;
  testing::internal::RE::Init(&local_b8,local_e8);
  bVar3 = testing::internal::DeathTest::Create
                    ("Derived()",&local_b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_recovery.cpp"
                     ,0x32,&local_118);
  bVar2 = true;
  if (bVar3) {
    if (local_118 != (DeathTest *)0x0) {
      local_110 = local_118;
      iVar5 = (*local_118->_vptr_DeathTest[2])();
      pDVar1 = local_118;
      if (iVar5 == 0) {
        extensions::ExitedOrKilled::ExitedOrKilled(local_108,3,0xb);
        iVar5 = (*local_118->_vptr_DeathTest[3])();
        bVar2 = extensions::ExitedOrKilled::operator()(local_108,iVar5);
        iVar5 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((char)iVar5 != '\0') goto LAB_0010c8b7;
        bVar2 = true;
        bVar3 = false;
      }
      else {
        if (iVar5 == 1) {
          bVar2 = testing::internal::AlwaysTrue();
          if (bVar2) {
            local_c8.m_pDerived = (Derived *)&local_c8;
            local_c8._vptr_Base = (_func_int **)&PTR_function_00144be8;
            Base::~Base((Base *)local_c8.m_pDerived);
          }
          (*local_118->_vptr_DeathTest[5])(local_118,2);
          (*pDVar1->_vptr_DeathTest[5])(pDVar1,0);
        }
LAB_0010c8b7:
        bVar2 = false;
        bVar3 = true;
      }
      if (local_110 != (DeathTest *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (local_110 != (DeathTest *)0x0)) {
          (*local_110->_vptr_DeathTest[1])();
        }
        local_110 = (DeathTest *)0x0;
      }
      if (!bVar3) goto LAB_0010c8f2;
    }
    bVar2 = false;
  }
LAB_0010c8f2:
  testing::internal::RE::~RE(&local_b8);
  if (!bVar2) {
    return;
  }
LAB_0010c901:
  testing::Message::Message((Message *)&local_b8);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_108,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_recovery.cpp"
             ,0x32,message);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)&local_b8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
  if ((((long *)local_b8.pattern_ != (long *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((long *)local_b8.pattern_ != (long *)0x0)) {
    (**(code **)(*(long *)local_b8.pattern_ + 8))();
  }
  return;
}

Assistant:

TEST_F (RecoveryTest, PureVirtualMethodCallTest) {
#ifdef _WIN32
    const char regex[] = "::PureCallHandler";
#else
    const char regex[] = "PosixCrashHandler::handleCrash";
#endif
    
    ASSERT_EXIT(Derived(), ::extensions::ExitedOrKilled(CHILLOUT_EXIT_CODE, SIGSEGV), regex);
}